

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *_woffset,int *_hoffset,int *_coffset,int *_outw,
          int *_outh,int *_outc)

{
  bool bVar1;
  int *piVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int end;
  int start;
  int axis_1;
  int i_1;
  int axis;
  int i;
  int num_axis;
  int _axes [3];
  int *axes_ptr;
  int *ends_ptr;
  int *starts_ptr;
  bool numpy_style_slice;
  int dims;
  int channels;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar3;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  byte local_a1;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c [3];
  int *local_60;
  int *local_58;
  int *local_50;
  byte local_41;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  
  local_34 = *(int *)(in_RSI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x30);
  local_3c = *(int *)(in_RSI + 0x34);
  local_40 = *(int *)(in_RSI + 0x28);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_a1 = 0;
  if (!bVar1) {
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_a1 = bVar1 ^ 0xff;
  }
  local_41 = local_a1 & 1;
  if (local_41 == 0) {
    *local_18 = *(int *)(in_RDI + 0xb8);
    *local_20 = *(int *)(in_RDI + 0xbc);
    *local_28 = *(int *)(in_RDI + 0xc0);
    *local_30 = local_34;
    *in_stack_00000008 = local_38;
    *in_stack_00000010 = local_3c;
    if ((local_40 == 1) &&
       (*local_30 = (local_34 - *(int *)(in_RDI + 0xb8)) - *(int *)(in_RDI + 0xd0),
       *(int *)(in_RDI + 0xc4) != -0xe9)) {
      piVar2 = std::min<int>((int *)(in_RDI + 0xc4),local_30);
      *local_30 = *piVar2;
    }
    if (local_40 == 2) {
      if (*(int *)(in_RDI + 0xbc) == -0xe9) {
        *local_18 = 0;
        *local_20 = *(int *)(in_RDI + 0xb8);
        *local_30 = local_34;
        *in_stack_00000008 = (local_38 - *(int *)(in_RDI + 0xb8)) - *(int *)(in_RDI + 0xd0);
        if (*(int *)(in_RDI + 0xc4) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 0xc4),in_stack_00000008);
          *in_stack_00000008 = *piVar2;
        }
      }
      else {
        *local_30 = (local_34 - *(int *)(in_RDI + 0xb8)) - *(int *)(in_RDI + 0xd0);
        if (*(int *)(in_RDI + 0xc4) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 0xc4),local_30);
          *local_30 = *piVar2;
        }
        *in_stack_00000008 = (local_38 - *(int *)(in_RDI + 0xbc)) - *(int *)(in_RDI + 0xd4);
        if (*(int *)(in_RDI + 200) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 200),in_stack_00000008);
          *in_stack_00000008 = *piVar2;
        }
      }
    }
    if (local_40 == 3) {
      if ((*(int *)(in_RDI + 0xbc) == -0xe9) && (*(int *)(in_RDI + 0xc0) == -0xe9)) {
        *local_18 = 0;
        *local_20 = 0;
        *local_30 = local_34;
        *in_stack_00000008 = local_38;
        *in_stack_00000010 = (local_3c - *(int *)(in_RDI + 0xb8)) - *(int *)(in_RDI + 0xd0);
        if (*(int *)(in_RDI + 0xc4) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 0xc4),in_stack_00000010);
          *in_stack_00000010 = *piVar2;
        }
      }
      else if (*(int *)(in_RDI + 0xc0) == -0xe9) {
        *local_18 = 0;
        *local_30 = local_34;
        *in_stack_00000008 = (local_38 - *(int *)(in_RDI + 0xb8)) - *(int *)(in_RDI + 0xd0);
        if (*(int *)(in_RDI + 0xc4) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 0xc4),in_stack_00000008);
          *in_stack_00000008 = *piVar2;
        }
        *in_stack_00000010 = (local_3c - *(int *)(in_RDI + 0xbc)) - *(int *)(in_RDI + 0xd4);
        if (*(int *)(in_RDI + 200) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 200),in_stack_00000010);
          *in_stack_00000010 = *piVar2;
        }
      }
      else {
        *local_30 = (local_34 - *(int *)(in_RDI + 0xb8)) - *(int *)(in_RDI + 0xd0);
        if (*(int *)(in_RDI + 0xc4) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 0xc4),local_30);
          *local_30 = *piVar2;
        }
        *in_stack_00000008 = (local_38 - *(int *)(in_RDI + 0xbc)) - *(int *)(in_RDI + 0xd4);
        if (*(int *)(in_RDI + 200) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 200),in_stack_00000008);
          *in_stack_00000008 = *piVar2;
        }
        *in_stack_00000010 = (local_3c - *(int *)(in_RDI + 0xd8)) - *(int *)(in_RDI + 0xd8);
        if (*(int *)(in_RDI + 0xcc) != -0xe9) {
          piVar2 = std::min<int>((int *)(in_RDI + 0xcc),in_stack_00000010);
          *in_stack_00000010 = *piVar2;
        }
      }
    }
  }
  else {
    *local_18 = 0;
    *local_20 = 0;
    *local_28 = 0;
    *local_30 = local_34;
    *in_stack_00000008 = local_38;
    *in_stack_00000010 = local_3c;
    local_50 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0xe0));
    local_58 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0x120));
    local_60 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0x160));
    local_6c[0] = 0;
    local_6c[1] = 1;
    local_6c[2] = 2;
    local_70 = *(int *)(in_RDI + 0x18c);
    if (local_70 == 0) {
      local_70 = local_40;
    }
    else {
      for (local_74 = 0; local_74 < local_70; local_74 = local_74 + 1) {
        local_78 = local_60[local_74];
        if (local_78 < 0) {
          local_78 = local_40 + local_78;
        }
        local_6c[local_74] = local_78;
      }
    }
    for (local_7c = 0; local_7c < local_70; local_7c = local_7c + 1) {
      local_80 = local_6c[local_7c];
      local_84 = local_50[local_7c];
      local_88 = local_58[local_7c];
      if (local_40 == 1) {
        local_b4 = local_84;
        if (local_84 < 0) {
          local_b4 = local_34 + local_84;
        }
        *local_18 = local_b4;
        local_b8 = local_88;
        if (local_88 < 1) {
          local_b8 = local_34 + local_88;
        }
        local_8c = local_b8;
        piVar2 = std::min<int>(&local_34,&local_8c);
        *local_30 = *piVar2 - *local_18;
      }
      if (local_40 == 2) {
        if (local_80 == 0) {
          if (local_84 < 0) {
            local_bc = local_38 + local_84;
          }
          else {
            local_bc = local_84;
          }
          *local_20 = local_bc;
          if (local_88 < 1) {
            local_c0 = local_38 + local_88;
          }
          else {
            local_c0 = local_88;
          }
          local_90 = local_c0;
          piVar2 = std::min<int>(&local_38,&local_90);
          *in_stack_00000008 = *piVar2 - *local_18;
        }
        if (local_80 == 1) {
          if (local_84 < 0) {
            local_c4 = local_34 + local_84;
          }
          else {
            local_c4 = local_84;
          }
          *local_18 = local_c4;
          if (local_88 < 1) {
            local_c8 = local_34 + local_88;
          }
          else {
            local_c8 = local_88;
          }
          local_94 = local_c8;
          piVar2 = std::min<int>(&local_34,&local_94);
          *local_30 = *piVar2 - *local_18;
        }
      }
      if (local_40 == 3) {
        if (local_80 == 0) {
          if (local_84 < 0) {
            local_cc = local_3c + local_84;
          }
          else {
            local_cc = local_84;
          }
          *local_28 = local_cc;
          if (local_88 < 1) {
            local_d0 = local_3c + local_88;
          }
          else {
            local_d0 = local_88;
          }
          local_98 = local_d0;
          piVar2 = std::min<int>(&local_3c,&local_98);
          *in_stack_00000010 = *piVar2 - *local_28;
        }
        if (local_80 == 1) {
          if (local_84 < 0) {
            local_d4 = local_38 + local_84;
          }
          else {
            local_d4 = local_84;
          }
          *local_20 = local_d4;
          if (local_88 < 1) {
            local_d8 = local_38 + local_88;
          }
          else {
            local_d8 = local_88;
          }
          local_9c = local_d8;
          piVar2 = std::min<int>(&local_38,&local_9c);
          *in_stack_00000008 = *piVar2 - *local_18;
        }
        if (local_80 == 2) {
          iVar3 = local_84;
          if (local_84 < 0) {
            iVar3 = local_34 + local_84;
          }
          *local_18 = iVar3;
          local_a0 = local_88;
          if (local_88 < 1) {
            local_a0 = local_34 + local_88;
          }
          piVar2 = std::min<int>(&local_34,&local_a0);
          *local_30 = *piVar2 - *local_18;
        }
      }
    }
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, int& _woffset, int& _hoffset, int& _coffset, int& _outw, int& _outh, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[3] = {0,1,2};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i=0; i<num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i=0; i<num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 0
            {
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 1)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 2)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _coffset = coffset;
        _outw = w;
        _outh = h;
        _outc = channels;

        if (dims == 1)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);
        }
        if (dims == 2)
        {
            if (hoffset == -233)
            {
                _woffset = 0;
                _hoffset = woffset;

                _outw = w;
                _outh = h - woffset - woffset2;
                if (outw != -233)
                    _outh = std::min(outw, _outh);
            }
            else
            {
                _outw = w - woffset - woffset2;
                if (outw != -233)
                    _outw = std::min(outw, _outw);

                _outh = h - hoffset - hoffset2;
                if (outh != -233)
                    _outh = std::min(outh, _outh);
            }
        }
        if (dims == 3)
        {
            if (hoffset == -233 && coffset == -233)
            {
                _woffset = 0;
                _hoffset = 0;

                _outw = w;
                _outh = h;
                _outc = channels - woffset - woffset2;
                if (outw != -233)
                    _outc = std::min(outw, _outc);
            }
            else if (coffset == -233)
            {
                _woffset = 0;

                _outw = w;
                _outh = h - woffset - woffset2;
                if (outw != -233)
                    _outh = std::min(outw, _outh);

                _outc = channels - hoffset - hoffset2;
                if (outh != -233)
                    _outc = std::min(outh, _outc);
            }
            else
            {
                _outw = w - woffset - woffset2;
                if (outw != -233)
                    _outw = std::min(outw, _outw);

                _outh = h - hoffset - hoffset2;
                if (outh != -233)
                    _outh = std::min(outh, _outh);

                _outc = channels - coffset2 - coffset2;
                if (outc != -233)
                    _outc = std::min(outc, _outc);
            }
        }
    }
}